

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlRecoverDoc(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 local_38;
  xmlChar *cur;
  xmlDocPtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlRecoverDoc");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"z:xmlRecoverDoc",&local_38);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      cur = (xmlChar *)xmlRecoverDoc(local_38);
      self_local = libxml_xmlDocPtrWrap((xmlDocPtr)cur);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlRecoverDoc(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlDocPtr c_retval;
    xmlChar * cur;

    if (libxml_deprecationWarning("xmlRecoverDoc") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"z:xmlRecoverDoc", &cur))
        return(NULL);

    c_retval = xmlRecoverDoc(cur);
    py_retval = libxml_xmlDocPtrWrap((xmlDocPtr) c_retval);
    return(py_retval);
}